

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void BinarySink_put_mp_ssh2(BinarySink *bs,mp_int *x)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  ulong val;
  
  sVar1 = mp_get_nbits(x);
  val = sVar1 + 8 >> 3;
  BinarySink_put_uint32(bs->binarysink_,val);
  if (sVar1 < 0xfffffffffffffff8) {
    lVar3 = val * 8;
    do {
      val = val - 1;
      lVar3 = lVar3 + -8;
      if (val >> 3 < x->nw) {
        uVar2 = x->w[val >> 3];
      }
      else {
        uVar2 = 0;
      }
      BinarySink_put_byte(bs->binarysink_,(uchar)(uVar2 >> ((byte)lVar3 & 0x38)));
    } while (val != 0);
  }
  return;
}

Assistant:

void BinarySink_put_mp_ssh2(BinarySink *bs, mp_int *x)
{
    size_t bytes = (mp_get_nbits(x) + 8) / 8;

    put_uint32(bs, bytes);
    for (size_t i = bytes; i-- > 0 ;)
        put_byte(bs, mp_get_byte(x, i));
}